

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_query_decoder.c
# Opt level: O2

int pt_qry_start(pt_query_decoder *decoder,uint64_t *ip)

{
  int iVar1;
  uint uVar2;
  uint8_t *puVar3;
  uint uVar4;
  pt_event ev;
  pt_event_decoder evdec;
  
  memcpy(&evdec,decoder,0x730);
  uVar4 = 2;
  while( true ) {
    if (decoder == (pt_query_decoder *)0x0) {
      puVar3 = (uint8_t *)0x0;
    }
    else {
      puVar3 = (decoder->evdec).pacdec.pos;
    }
    if (evdec.pacdec.pos != puVar3) goto LAB_00107989;
    iVar1 = pt_evt_next(&evdec,&ev,0x48);
    if (iVar1 < 0) break;
    if ((ev._4_1_ & 2) == 0) goto LAB_00107989;
    if (ev.type == ptev_enabled) {
      uVar4 = 0;
      if (ip != (uint64_t *)0x0) {
        *ip = ev.variant.enabled.ip;
      }
LAB_00107989:
      decoder->status = 0;
      pt_qry_fetch_event(decoder);
      uVar2 = pt_qry_status_flags(decoder);
      if (-1 < (int)uVar2) {
        uVar2 = uVar2 | uVar4;
      }
      return uVar2;
    }
  }
  if (iVar1 != -7) {
    return iVar1;
  }
  goto LAB_00107989;
}

Assistant:

static int pt_qry_start(struct pt_query_decoder *decoder, uint64_t *ip)
{
	struct pt_event_decoder evdec;
	struct pt_event ev;
	int errcode, flags, status;

	if (!decoder)
		return -pte_invalid;

	/* We need to process satus update events from PSB+ in order to
	 * provide the start IP.
	 *
	 * On the other hand, we need to provide those same status events to
	 * our user.  We do that by using a local copy of our event decoder, so
	 * when we're done, we rewind back to where we started.
	 */
	evdec = decoder->evdec;

	status = pts_ip_suppressed;

	/* Process status update events from PSB+ to initialize our state. */
	for (;;) {
		/* Check that we're still processing the initial events.
		 *
		 * When the event decoder moves ahead, we're done with the
		 * initial PSB+.  We may get additional events from an adjacent
		 * PSB+, but we don't want to process them here.
		 */
		if (pt_evt_pos(&evdec) != pt_qry_pos(decoder))
			break;

		errcode = pt_evt_next(&evdec, &ev, sizeof(ev));
		if (errcode < 0) {
			if (errcode != -pte_eos)
				return errcode;

			break;
		}

		if (!ev.status_update)
			break;

		switch (ev.type) {
		case ptev_enabled:
			status &= ~pts_ip_suppressed;
			if (ip)
				*ip = ev.variant.enabled.ip;

			break;

		default:
			continue;
		}

		break;
	}

	decoder->status = 0;

	errcode = pt_qry_fetch_event(decoder);
	if (errcode < 0)
		return errcode;

	flags = pt_qry_status_flags(decoder);
	if (flags < 0)
		return flags;

	status |= flags;

	return status;
}